

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFInterpolater.cpp
# Opt level: O1

void __thiscall
amrex::MFCellConsLinInterp::interp
          (MFCellConsLinInterp *this,MultiFab *crsemf,int ccomp,MultiFab *finemf,int fcomp,int nc,
          IntVect *ng,Geometry *cgeom,Geometry *fgeom,Box *dest_domain,IntVect *ratio,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs,int bcomp)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  pointer pBVar6;
  FArrayBox *pFVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  FabArray<amrex::FArrayBox> *this_00;
  uint uVar11;
  uint uVar12;
  int *piVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  undefined4 in_register_00000014;
  long lVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  long lVar26;
  double *pdVar27;
  int iVar28;
  int iVar29;
  uint uVar30;
  long lVar31;
  long lVar32;
  uint uVar33;
  long lVar34;
  uint uVar35;
  uint uVar36;
  long lVar37;
  int iVar38;
  uint uVar39;
  uint uVar40;
  long lVar41;
  long lVar42;
  ulong uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  ulong uVar48;
  uint uVar49;
  int iVar50;
  uint uVar51;
  long lVar52;
  long lVar53;
  int iVar54;
  long lVar55;
  bool bVar56;
  double dVar57;
  undefined1 auVar58 [16];
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  undefined4 uVar66;
  undefined4 uVar67;
  undefined1 auVar68 [16];
  Box result;
  MFIter mfi;
  FArrayBox tmpfab;
  int local_47c;
  double *local_470;
  int local_468;
  long local_448;
  ulong local_440;
  ulong local_438;
  long local_430;
  long local_418;
  double *local_3e0;
  long local_3d8;
  double *local_3d0;
  ulong local_3c8;
  int local_380;
  int local_37c;
  int local_374;
  int local_370;
  int local_368;
  int local_364;
  int local_360;
  Box local_348;
  long local_328;
  long local_320;
  ulong local_318;
  long local_310;
  long local_308;
  double *local_300;
  long local_2f8;
  undefined8 local_2f0;
  long local_2e8;
  long local_2e0;
  double *local_2d8;
  double *local_2d0;
  long local_2c8;
  double *local_2c0;
  ulong local_2b8;
  ulong local_2b0;
  double *local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  long local_288;
  double *local_280;
  long local_278;
  long local_270;
  int local_264;
  int local_260;
  int local_25c;
  int local_258;
  int local_254;
  int local_250;
  int local_24c;
  int local_248;
  int local_244;
  int local_240;
  int local_23c;
  Array4<const_double> local_238;
  long local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  long local_1e0;
  ulong local_1d8;
  long local_1d0;
  long local_1c8;
  long local_1c0;
  FabArray<amrex::FArrayBox> *local_1b8;
  MFCellConsLinInterp *local_1b0;
  FabArray<amrex::FArrayBox> *local_1a8;
  long local_1a0;
  long local_198;
  long local_190;
  long local_188;
  long local_180;
  pointer local_178;
  long local_170;
  long local_168;
  long local_160;
  long local_158;
  long local_150;
  long local_148;
  int *local_140;
  Box local_134;
  MFIter local_118;
  BaseFab<double> local_b8;
  Array4<double> local_70;
  
  local_2f0 = CONCAT44(in_register_00000014,ccomp);
  pBVar6 = (bcs->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
           super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_264 = fcomp;
  local_1b0 = this;
  FArrayBox::FArrayBox((FArrayBox *)&local_b8);
  local_1a8 = &finemf->super_FabArray<amrex::FArrayBox>;
  MFIter::MFIter(&local_118,(FabArrayBase *)finemf,'\0');
  if (local_118.currentIndex < local_118.endIndex) {
    local_178 = pBVar6 + bcomp;
    local_260 = nc * 3;
    local_318 = (ulong)(uint)nc;
    local_1e8 = (ulong)(uint)(nc * 2);
    local_1c0 = local_1e8 * 8;
    local_1c8 = local_318 * 8;
    local_140 = pBVar6[bcomp].bc + 5;
    local_170 = (long)(int)local_2f0 << 3;
    local_1b8 = &crsemf->super_FabArray<amrex::FArrayBox>;
    do {
      this_00 = local_1b8;
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_70,local_1a8,&local_118);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_238,this_00,&local_118);
      piVar13 = &local_118.currentIndex;
      if (local_118.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar13 = ((local_118.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + local_118.currentIndex;
      }
      pFVar7 = (this_00->m_fabs_v).
               super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
               super__Vector_impl_data._M_start[*piVar13];
      uVar8 = *(undefined8 *)(pFVar7->super_BaseFab<double>).domain.smallend.vect;
      uVar9 = *(undefined8 *)((long)&(pFVar7->super_BaseFab<double>).domain.smallend + 8);
      uVar10 = *(undefined8 *)((long)&(pFVar7->super_BaseFab<double>).domain.bigend + 8);
      local_348.bigend.vect[1] =
           (int)((ulong)*(undefined8 *)(pFVar7->super_BaseFab<double>).domain.bigend.vect >> 0x20);
      local_348.bigend.vect[2] = (int)uVar10;
      local_348.btype.itype = (uint)((ulong)uVar10 >> 0x20);
      local_348.smallend.vect[2] = (int)uVar9;
      local_348.bigend.vect[0] = (int)((ulong)uVar9 >> 0x20);
      local_348.smallend.vect[0] = (int)uVar8;
      local_348.smallend.vect[1] = (int)((ulong)uVar8 >> 0x20);
      local_348.smallend.vect[2] = local_348.smallend.vect[2] + 1;
      local_348.bigend.vect[0] = local_348.bigend.vect[0] - 1;
      local_348.smallend.vect[1] = local_348.smallend.vect[1] + 1;
      local_348.smallend.vect[0] = local_348.smallend.vect[0] + 1;
      local_348.bigend.vect[1] = local_348.bigend.vect[1] - 1;
      local_348.bigend.vect[2] = local_348.bigend.vect[2] + -1;
      FArrayBox::resize((FArrayBox *)&local_b8,&local_348,local_260,(Arena *)0x0);
      local_280 = local_b8.dptr;
      local_270 = (long)local_b8.domain.smallend.vect[0];
      local_278 = (long)local_b8.domain.smallend.vect[1];
      local_288 = (long)local_b8.domain.smallend.vect[2];
      local_2f8 = (long)((local_b8.domain.bigend.vect[0] - local_b8.domain.smallend.vect[0]) + 1);
      local_1f8 = (long)((local_b8.domain.bigend.vect[1] - local_b8.domain.smallend.vect[1]) + 1);
      local_1d0 = local_1f8 * local_2f8;
      lVar16 = (long)((local_b8.domain.bigend.vect[2] - local_b8.domain.smallend.vect[2]) + 1);
      local_1e0 = local_1d0 * lVar16;
      BATransformer::operator()
                (&local_134,&((local_118.fabArray)->boxarray).m_bat,
                 (Box *)((long)((local_118.index_map)->super_vector<int,_std::allocator<int>_>).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[local_118.currentIndex] * 0x1c +
                        *(long *)&((((local_118.fabArray)->boxarray).m_ref.
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      iVar28 = local_134.smallend.vect[0] - ng->vect[0];
      uVar33 = local_134.smallend.vect[1] - ng->vect[1];
      uVar35 = local_134.smallend.vect[2] - ng->vect[2];
      iVar38 = ng->vect[0] + local_134.bigend.vect[0];
      uVar44 = ng->vect[1] + local_134.bigend.vect[1];
      uVar49 = ng->vect[2] + local_134.bigend.vect[2];
      iVar14 = (dest_domain->smallend).vect[0];
      uVar15 = (dest_domain->smallend).vect[1];
      if (iVar28 <= iVar14) {
        iVar28 = iVar14;
      }
      if ((int)uVar33 <= (int)uVar15) {
        uVar33 = uVar15;
      }
      uVar15 = (dest_domain->smallend).vect[2];
      if ((int)uVar35 <= (int)uVar15) {
        uVar35 = uVar15;
      }
      iVar14 = (dest_domain->bigend).vect[0];
      if (iVar14 <= iVar38) {
        iVar38 = iVar14;
      }
      uVar15 = (dest_domain->bigend).vect[1];
      if ((int)uVar15 <= (int)uVar44) {
        uVar44 = uVar15;
      }
      uVar15 = (dest_domain->bigend).vect[2];
      if ((int)uVar15 <= (int)uVar49) {
        uVar49 = uVar15;
      }
      if (local_1b0->do_linear_limiting == true) {
        local_24c = local_348.bigend.vect[2];
        if (local_348.smallend.vect[2] <= local_348.bigend.vect[2]) {
          local_1d8 = local_348.smallend.vect._0_8_ & 0xffffffff;
          local_1f0 = (ulong)(uint)local_348.smallend.vect[1];
          local_188 = local_278 * -8;
          local_190 = local_1c0 * lVar16 + local_288 * -8;
          local_2b0 = local_270 * -8;
          local_198 = local_1f8 * 8;
          lVar37 = local_2f8 * lVar16 * local_198;
          local_180 = lVar16 * local_1c8 + local_288 * -8;
          local_1a0 = -local_288;
          local_23c = local_348.smallend.vect[0] + 2;
          local_240 = local_348.smallend.vect[0] + -2;
          local_250 = local_348.smallend.vect[1] + 2;
          local_254 = local_348.smallend.vect[1] - 2;
          local_37c = local_348.smallend.vect[2] + 2;
          local_380 = local_348.smallend.vect[2] + -2;
          local_370 = local_348.smallend.vect[2] + -1;
          local_258 = local_348.smallend.vect[1] - 1;
          local_25c = local_348.smallend.vect[1] + 1;
          local_244 = local_348.smallend.vect[0] + -1;
          local_248 = local_348.smallend.vect[0] + 1;
          iVar14 = local_348.smallend.vect[2];
          local_374 = local_348.smallend.vect[2];
          do {
            local_374 = local_374 + 1;
            if (local_348.smallend.vect[1] <= local_348.bigend.vect[1]) {
              lVar16 = (long)iVar14;
              local_160 = (long)local_37c;
              local_168 = (long)local_380;
              local_2a8 = (double *)CONCAT44(local_2a8._4_4_,iVar14 + -2);
              local_148 = (local_190 + lVar16 * 8) * local_1f8 + local_188;
              local_150 = (local_180 + lVar16 * 8) * local_1f8 + local_188;
              local_158 = (local_1a0 + lVar16) * local_198 + local_188;
              local_468 = local_25c;
              local_438 = local_1f0;
              local_368 = local_250;
              local_364 = local_254;
              local_360 = local_258;
              do {
                if (local_348.smallend.vect[0] <= local_348.bigend.vect[0]) {
                  lVar41 = (long)(int)(uint)local_438;
                  local_290 = (long)local_238.begin.x;
                  local_298 = (long)local_238.begin.y;
                  local_2a0 = (long)local_238.begin.z;
                  lVar31 = local_238.kstride * 8;
                  lVar22 = (lVar16 - local_2a0) * lVar31;
                  lVar17 = local_238.jstride * 8;
                  lVar34 = (lVar41 - local_298) * lVar17;
                  lVar53 = lVar22 + lVar34;
                  local_2e8 = lVar53 + local_290 * -8 + (long)local_238.p;
                  local_2b8 = (local_368 - local_298) * lVar17 + lVar22 + local_290 * -8 +
                              (long)local_238.p;
                  local_2c0 = (double *)
                              ((local_364 - local_298) * lVar17 + lVar22 + local_290 * -8 +
                              (long)local_238.p);
                  local_2c8 = (local_160 - local_2a0) * lVar31 + lVar34 + local_290 * -8 +
                              (long)local_238.p;
                  local_2d0 = (double *)
                              ((local_168 - local_2a0) * lVar31 + lVar34 + local_290 * -8 +
                              (long)local_238.p);
                  local_2d8 = (double *)
                              ((local_370 - local_238.begin.z) * lVar31 + lVar34 + local_290 * -8 +
                              (long)local_238.p);
                  local_320 = (local_374 - local_238.begin.z) * lVar31 + lVar34 + local_290 * -8 +
                              (long)local_238.p;
                  local_328 = (local_360 - local_238.begin.y) * lVar17 + lVar22 + local_290 * -8 +
                              (long)local_238.p;
                  local_2e0 = (local_468 - local_238.begin.y) * lVar17 + lVar22 + local_290 * -8 +
                              (long)local_238.p;
                  lVar22 = (local_148 + lVar41 * 8) * local_2f8;
                  lVar31 = (local_150 + lVar41 * 8) * local_2f8;
                  lVar34 = (local_158 + lVar41 * 8) * local_2f8;
                  lVar17 = local_170 * local_238.nstride;
                  lVar41 = local_238.nstride * 8;
                  local_300 = (double *)CONCAT44(local_300._4_4_,local_244 - local_238.begin.x);
                  local_308 = CONCAT44(local_308._4_4_,local_248 - local_238.begin.x);
                  uVar15 = (cgeom->domain).smallend.vect[0];
                  uVar36 = (cgeom->domain).smallend.vect[1];
                  uVar30 = (cgeom->domain).bigend.vect[0];
                  uVar45 = (cgeom->domain).bigend.vect[1];
                  iVar1 = (cgeom->domain).smallend.vect[2];
                  iVar2 = (cgeom->domain).bigend.vect[2];
                  local_310 = CONCAT44(local_310._4_4_,local_240);
                  uVar48 = local_1d8;
                  iVar20 = local_23c;
                  do {
                    uVar25 = (uint)uVar48;
                    lVar23 = (long)(int)uVar25;
                    lVar24 = local_2b0 + lVar23 * 8;
                    dVar59 = 1.0;
                    dVar64 = 1.0;
                    dVar62 = 1.0;
                    if (0 < nc) {
                      local_448 = local_2e8 + (long)iVar20 * 8;
                      lVar52 = local_2e8 + lVar23 * 8;
                      local_430 = local_2e8 + (long)(int)local_310 * 8;
                      local_418 = local_2b8 + lVar23 * 8;
                      local_3d0 = local_2c0 + lVar23;
                      local_3d8 = local_2c8 + lVar23 * 8;
                      local_3e0 = local_2d0 + lVar23;
                      local_470 = local_2d8 + lVar23;
                      lVar55 = local_320 + lVar23 * 8;
                      lVar26 = local_328 + lVar23 * 8;
                      lVar23 = local_2e0 + lVar23 * 8;
                      lVar32 = (long)local_238.p + (long)(int)local_300 * 8 + lVar53;
                      lVar42 = (long)local_238.p + (long)(int)local_308 * 8 + lVar53;
                      dVar64 = 1.0;
                      dVar59 = 1.0;
                      lVar18 = lVar24;
                      piVar13 = local_140;
                      uVar48 = local_318;
                      dVar63 = 1.0;
                      do {
                        dVar62 = *(double *)(lVar42 + lVar17);
                        dVar60 = *(double *)(lVar32 + lVar17);
                        dVar57 = (dVar62 - dVar60) * 0.5;
                        if ((uVar15 == uVar25) && (((BCRec *)(piVar13 + -5))->bc[0] - 3U < 2)) {
                          if ((int)(uVar25 + 2) < local_238.end.x) {
                            dVar57 = *(double *)(local_448 + lVar17) * -0.1 +
                                     dVar62 * 0.6666666666666666 +
                                     dVar60 * -1.0666666666666667 +
                                     *(double *)(lVar52 + lVar17) * 0.5;
                          }
                          else {
                            dVar57 = (dVar60 * -6.0 + *(double *)(lVar52 + lVar17) * 5.0 + dVar62) *
                                     0.25;
                          }
                        }
                        if ((uVar30 == uVar25) && (piVar13[-2] - 3U < 2)) {
                          if ((int)(uVar25 - 2) < local_238.begin.x) {
                            dVar57 = (dVar62 * -6.0 + *(double *)(lVar52 + lVar17) * 5.0 + dVar60) *
                                     -0.25;
                          }
                          else {
                            dVar57 = *(double *)(local_430 + lVar17) * 0.1 +
                                     dVar60 * -0.6666666666666666 +
                                     dVar62 * 1.0666666666666667 +
                                     *(double *)(lVar52 + lVar17) * -0.5;
                          }
                        }
                        dVar60 = *(double *)(lVar52 + lVar17) - dVar60;
                        dVar62 = dVar62 - *(double *)(lVar52 + lVar17);
                        dVar60 = dVar60 + dVar60;
                        dVar62 = dVar62 + dVar62;
                        dVar61 = 0.0;
                        if (0.0 <= dVar62 * dVar60) {
                          dVar61 = ABS(dVar60);
                          dVar62 = ABS(dVar62);
                          if (dVar62 <= dVar61) {
                            dVar61 = dVar62;
                          }
                        }
                        if ((dVar57 != 0.0) || (dVar62 = dVar63, NAN(dVar57))) {
                          dVar62 = ABS(dVar57);
                          if (dVar61 <= ABS(dVar57)) {
                            dVar62 = dVar61;
                          }
                          dVar62 = (dVar62 * (double)((ulong)dVar57 & 0x8000000000000000 |
                                                     0x3ff0000000000000)) / dVar57;
                          if (dVar63 <= dVar62) {
                            dVar62 = dVar63;
                          }
                        }
                        *(double *)((long)local_280 + lVar18 + lVar34) = dVar57;
                        dVar63 = *(double *)(lVar23 + lVar17);
                        dVar60 = *(double *)(lVar26 + lVar17);
                        dVar57 = (dVar63 - dVar60) * 0.5;
                        if ((uVar36 == (uint)local_438) && (piVar13[-4] - 3U < 2)) {
                          if ((int)((uint)local_438 + 2) < local_238.end.y) {
                            dVar57 = *(double *)(local_418 + lVar17) * -0.1 +
                                     dVar63 * 0.6666666666666666 +
                                     dVar60 * -1.0666666666666667 +
                                     *(double *)(lVar52 + lVar17) * 0.5;
                          }
                          else {
                            dVar57 = (dVar60 * -6.0 + *(double *)(lVar52 + lVar17) * 5.0 + dVar63) *
                                     0.25;
                          }
                        }
                        if ((uVar45 == (uint)local_438) && (piVar13[-1] - 3U < 2)) {
                          if ((int)((uint)local_438 - 2) < local_238.begin.y) {
                            dVar57 = (dVar63 * -6.0 + *(double *)(lVar52 + lVar17) * 5.0 + dVar60) *
                                     -0.25;
                          }
                          else {
                            dVar57 = *(double *)((long)local_3d0 + lVar17) * 0.1 +
                                     dVar60 * -0.6666666666666666 +
                                     dVar63 * 1.0666666666666667 +
                                     *(double *)(lVar52 + lVar17) * -0.5;
                          }
                        }
                        dVar60 = *(double *)(lVar52 + lVar17) - dVar60;
                        dVar63 = dVar63 - *(double *)(lVar52 + lVar17);
                        dVar60 = dVar60 + dVar60;
                        dVar63 = dVar63 + dVar63;
                        dVar61 = 0.0;
                        if (0.0 <= dVar63 * dVar60) {
                          dVar61 = ABS(dVar60);
                          dVar63 = ABS(dVar63);
                          if (dVar63 <= dVar61) {
                            dVar61 = dVar63;
                          }
                        }
                        if ((dVar57 != 0.0) || (dVar63 = dVar64, NAN(dVar57))) {
                          dVar63 = ABS(dVar57);
                          if (dVar61 <= ABS(dVar57)) {
                            dVar63 = dVar61;
                          }
                          dVar63 = (dVar63 * (double)((ulong)dVar57 & 0x8000000000000000 |
                                                     0x3ff0000000000000)) / dVar57;
                          if (dVar64 <= dVar63) {
                            dVar63 = dVar64;
                          }
                        }
                        dVar64 = dVar63;
                        *(double *)((long)local_280 + lVar18 + lVar31) = dVar57;
                        dVar63 = *(double *)(lVar55 + lVar17);
                        dVar60 = *(double *)((long)local_470 + lVar17);
                        dVar57 = (dVar63 - dVar60) * 0.5;
                        if ((iVar1 == iVar14) && (piVar13[-3] - 3U < 2)) {
                          if (iVar14 + 2 < local_238.end.z) {
                            dVar57 = *(double *)(local_3d8 + lVar17) * -0.1 +
                                     dVar63 * 0.6666666666666666 +
                                     dVar60 * -1.0666666666666667 +
                                     *(double *)(lVar52 + lVar17) * 0.5;
                          }
                          else {
                            dVar57 = (dVar60 * -6.0 + *(double *)(lVar52 + lVar17) * 5.0 + dVar63) *
                                     0.25;
                          }
                        }
                        if ((iVar2 == iVar14) && (*piVar13 - 3U < 2)) {
                          if (iVar14 + -2 < local_238.begin.z) {
                            dVar57 = (dVar63 * -6.0 + *(double *)(lVar52 + lVar17) * 5.0 + dVar60) *
                                     -0.25;
                          }
                          else {
                            dVar57 = *(double *)((long)local_3e0 + lVar17) * 0.1 +
                                     dVar60 * -0.6666666666666666 +
                                     dVar63 * 1.0666666666666667 +
                                     *(double *)(lVar52 + lVar17) * -0.5;
                          }
                        }
                        dVar60 = *(double *)(lVar52 + lVar17) - dVar60;
                        dVar63 = dVar63 - *(double *)(lVar52 + lVar17);
                        dVar60 = dVar60 + dVar60;
                        dVar63 = dVar63 + dVar63;
                        dVar61 = 0.0;
                        if (0.0 <= dVar63 * dVar60) {
                          dVar61 = ABS(dVar60);
                          dVar63 = ABS(dVar63);
                          if (dVar63 <= dVar61) {
                            dVar61 = dVar63;
                          }
                        }
                        if ((dVar57 != 0.0) || (dVar63 = dVar59, NAN(dVar57))) {
                          dVar63 = ABS(dVar57);
                          if (dVar61 <= ABS(dVar57)) {
                            dVar63 = dVar61;
                          }
                          dVar63 = (dVar63 * (double)((ulong)dVar57 & 0x8000000000000000 |
                                                     0x3ff0000000000000)) / dVar57;
                          if (dVar59 <= dVar63) {
                            dVar63 = dVar59;
                          }
                        }
                        dVar59 = dVar63;
                        *(double *)((long)local_280 + lVar18 + lVar22) = dVar57;
                        lVar18 = lVar18 + lVar37;
                        piVar13 = piVar13 + 6;
                        local_448 = local_448 + lVar41;
                        lVar52 = lVar52 + lVar41;
                        local_430 = local_430 + lVar41;
                        local_418 = local_418 + lVar41;
                        local_3d0 = local_3d0 + local_238.nstride;
                        local_3d8 = local_3d8 + lVar41;
                        local_3e0 = local_3e0 + local_238.nstride;
                        local_470 = local_470 + local_238.nstride;
                        lVar55 = lVar55 + lVar41;
                        lVar26 = lVar26 + lVar41;
                        lVar23 = lVar23 + lVar41;
                        lVar32 = lVar32 + lVar41;
                        lVar42 = lVar42 + lVar41;
                        uVar48 = uVar48 - 1;
                        dVar63 = dVar62;
                      } while (uVar48 != 0);
                    }
                    uVar48 = local_318;
                    if (0 < nc) {
                      do {
                        *(double *)((long)local_280 + lVar24 + lVar34) =
                             *(double *)((long)local_280 + lVar24 + lVar34) * dVar62;
                        *(double *)((long)local_280 + lVar24 + lVar31) =
                             *(double *)((long)local_280 + lVar24 + lVar31) * dVar64;
                        *(double *)((long)local_280 + lVar24 + lVar22) =
                             *(double *)((long)local_280 + lVar24 + lVar22) * dVar59;
                        lVar24 = lVar24 + lVar37;
                        uVar48 = uVar48 - 1;
                      } while (uVar48 != 0);
                    }
                    iVar20 = iVar20 + 1;
                    local_310 = CONCAT44(local_310._4_4_,(int)local_310 + 1);
                    local_300 = (double *)CONCAT44(local_300._4_4_,(int)local_300 + 1);
                    local_308 = CONCAT44(local_308._4_4_,(int)local_308 + 1);
                    uVar48 = (ulong)(uVar25 + 1);
                  } while (uVar25 != local_348.bigend.vect[0]);
                }
                local_368 = local_368 + 1;
                local_364 = local_364 + 1;
                local_360 = local_360 + 1;
                local_468 = local_468 + 1;
                bVar56 = (uint)local_438 != local_348.bigend.vect[1];
                local_438 = (ulong)((uint)local_438 + 1);
              } while (bVar56);
            }
            local_37c = local_37c + 1;
            local_380 = local_380 + 1;
            local_370 = local_370 + 1;
            bVar56 = iVar14 != local_348.bigend.vect[2];
            iVar14 = iVar14 + 1;
          } while (bVar56);
        }
      }
      else if (0 < nc) {
        local_320 = CONCAT44(local_320._4_4_,local_348.smallend.vect[1]);
        local_328 = CONCAT44(local_328._4_4_,local_348.bigend.vect[2]);
        local_2b0 = (ulong)(uint)local_348.bigend.vect[0];
        local_2e8 = (long)local_348.smallend.vect[0] + -1;
        local_3c8 = 0;
        do {
          if (local_348.smallend.vect[2] <= local_348.bigend.vect[2]) {
            iVar20 = (int)local_3c8;
            pBVar6 = local_178 + local_3c8;
            local_2e0 = (long)((int)local_2f0 + iVar20);
            iVar14 = local_348.smallend.vect[2];
            do {
              if (local_348.smallend.vect[1] <= local_348.bigend.vect[1]) {
                lVar37 = (long)local_238.begin.x;
                iVar19 = iVar14 - local_238.begin.z;
                lVar16 = local_238.kstride * iVar19;
                lVar53 = local_238.nstride * local_2e0;
                local_2b8 = (ulong)(uint)~local_238.begin.y;
                local_308 = ((iVar14 + 2) - local_238.begin.z) * local_238.kstride;
                local_310 = ((iVar14 + -2) - local_238.begin.z) * local_238.kstride;
                local_2c0 = local_280 + (iVar14 - (int)local_288) * local_1d0;
                local_2c8 = (ulong)(uint)((int)local_2e8 - local_238.begin.x) << 0x20;
                iVar1 = (cgeom->domain).smallend.vect[0];
                iVar2 = (cgeom->domain).bigend.vect[0];
                local_2d0 = local_238.p;
                local_2d8 = local_238.p + lVar53 + lVar16;
                uVar15 = (cgeom->domain).smallend.vect[1];
                iVar5 = (cgeom->domain).smallend.vect[2];
                uVar36 = (cgeom->domain).bigend.vect[1];
                iVar54 = (cgeom->domain).bigend.vect[2];
                uVar30 = local_348.smallend.vect[1];
                do {
                  if (local_348.smallend.vect[0] <= local_348.bigend.vect[0]) {
                    iVar50 = uVar30 - local_238.begin.y;
                    lVar34 = local_238.jstride * iVar50;
                    local_2a8 = local_2d8 +
                                (int)((uVar30 + 2) - local_238.begin.y) * local_238.jstride;
                    local_300 = local_2d8 +
                                (int)((uVar30 - 2) - local_238.begin.y) * local_238.jstride;
                    lVar31 = (int)(uVar30 - (int)local_278) * local_2f8;
                    local_290 = (long)local_238.end.x;
                    local_298 = CONCAT44(local_298._4_4_,local_238.end.y);
                    iVar21 = ratio->vect[1];
                    local_2a0 = CONCAT44(local_2a0._4_4_,local_238.end.z);
                    iVar3 = ratio->vect[2];
                    iVar4 = ratio->vect[0];
                    auVar58._0_8_ = (double)(iVar4 * 2);
                    auVar58._8_8_ = (double)(iVar3 * 2);
                    lVar17 = (long)local_348.smallend.vect[0];
                    lVar22 = local_2c8;
                    do {
                      iVar29 = (int)(lVar17 + 1);
                      dVar62 = local_238.p[lVar34 + lVar16 + lVar53 + (iVar29 - local_238.begin.x)];
                      dVar64 = local_238.p
                               [lVar34 + lVar16 + lVar53 + (~local_238.begin.x + (int)lVar17)];
                      dVar59 = (dVar62 - dVar64) * 0.5;
                      if ((lVar17 == iVar1) && (pBVar6->bc[0] - 3U < 2)) {
                        if (lVar17 + 2 < local_290) {
                          dVar59 = local_238.p[lVar34 + lVar16 + lVar53 + ((lVar17 + 2) - lVar37)] *
                                   -0.1 + dVar62 * 0.6666666666666666 +
                                          dVar64 * -1.0666666666666667 +
                                          local_238.p[lVar34 + lVar16 + lVar53 + (lVar17 - lVar37)]
                                          * 0.5;
                        }
                        else {
                          dVar59 = (dVar64 * -6.0 +
                                   local_238.p[lVar34 + lVar16 + lVar53 + (lVar17 - lVar37)] * 5.0 +
                                   dVar62) * 0.25;
                        }
                      }
                      if ((lVar17 == iVar2) && (pBVar6->bc[3] - 3U < 2)) {
                        if (lVar17 + -2 < lVar37) {
                          dVar59 = (dVar62 * -6.0 +
                                   local_238.p[lVar34 + lVar16 + lVar53 + (lVar17 - lVar37)] * 5.0 +
                                   dVar64) * -0.25;
                        }
                        else {
                          dVar59 = local_238.p[lVar34 + lVar16 + lVar53 + ((lVar17 + -2) - lVar37)]
                                   * 0.1 + dVar64 * -0.6666666666666666 +
                                           dVar62 * 1.0666666666666667 +
                                           local_238.p[lVar34 + lVar16 + lVar53 + (lVar17 - lVar37)]
                                           * -0.5;
                        }
                      }
                      lVar41 = lVar17 - lVar37;
                      dVar63 = local_238.p[lVar34 + lVar41 + lVar16 + lVar53];
                      dVar64 = (dVar63 - dVar64) + (dVar63 - dVar64);
                      dVar60 = (dVar62 - dVar63) + (dVar62 - dVar63);
                      dVar62 = 0.0;
                      if (0.0 <= dVar60 * dVar64) {
                        dVar62 = ABS(dVar64);
                        dVar60 = ABS(dVar60);
                        if (dVar60 <= dVar62) {
                          dVar62 = dVar60;
                        }
                      }
                      dVar64 = local_2d8[(iVar50 + 1) * local_238.jstride + lVar41];
                      dVar60 = local_2d8[(int)(~local_238.begin.y + uVar30) * local_238.jstride +
                                         lVar41];
                      dVar57 = (dVar64 - dVar60) * 0.5;
                      if ((uVar15 == uVar30) && (pBVar6->bc[1] - 3U < 2)) {
                        if ((int)(uVar30 + 2) < local_238.end.y) {
                          dVar57 = local_2a8[lVar41] * -0.1 +
                                   dVar64 * 0.6666666666666666 +
                                   dVar60 * -1.0666666666666667 + dVar63 * 0.5;
                        }
                        else {
                          dVar57 = (dVar60 * -6.0 + dVar63 * 5.0 + dVar64) * 0.25;
                        }
                      }
                      if ((uVar36 == uVar30) && (pBVar6->bc[4] - 3U < 2)) {
                        if ((int)(uVar30 - 2) < local_238.begin.y) {
                          dVar57 = (dVar64 * -6.0 + dVar63 * 5.0 + dVar60) * -0.25;
                        }
                        else {
                          dVar57 = local_300[lVar41] * 0.1 +
                                   dVar60 * -0.6666666666666666 +
                                   dVar64 * 1.0666666666666667 + dVar63 * -0.5;
                        }
                      }
                      dVar60 = (dVar63 - dVar60) + (dVar63 - dVar60);
                      dVar61 = (dVar64 - dVar63) + (dVar64 - dVar63);
                      dVar64 = 0.0;
                      if (0.0 <= dVar61 * dVar60) {
                        dVar64 = ABS(dVar60);
                        dVar61 = ABS(dVar61);
                        if (dVar61 <= dVar64) {
                          dVar64 = dVar61;
                        }
                      }
                      dVar60 = local_238.p
                               [lVar34 + lVar41 + (iVar19 + 1) * local_238.kstride + lVar53];
                      dVar61 = local_238.p
                               [lVar34 + lVar41 + (~local_238.begin.z + iVar14) * local_238.kstride
                                                  + lVar53];
                      dVar65 = (dVar60 - dVar61) * 0.5;
                      if ((iVar5 == iVar14) && (pBVar6->bc[2] - 3U < 2)) {
                        if (iVar14 + 2 < local_238.end.z) {
                          dVar65 = local_238.p[lVar34 + lVar41 + local_308 + lVar53] * -0.1 +
                                   dVar60 * 0.6666666666666666 +
                                   dVar61 * -1.0666666666666667 + dVar63 * 0.5;
                        }
                        else {
                          dVar65 = (dVar61 * -6.0 + dVar63 * 5.0 + dVar60) * 0.25;
                        }
                      }
                      if ((iVar54 == iVar14) && (pBVar6->bc[5] - 3U < 2)) {
                        if (iVar14 + -2 < local_238.begin.z) {
                          dVar65 = (dVar60 * -6.0 + dVar63 * 5.0 + dVar61) * -0.25;
                        }
                        else {
                          dVar65 = local_238.p[lVar34 + lVar41 + local_310 + lVar53] * 0.1 +
                                   dVar61 * -0.6666666666666666 +
                                   dVar60 * 1.0666666666666667 + dVar63 * -0.5;
                        }
                      }
                      dVar61 = (dVar63 - dVar61) + (dVar63 - dVar61);
                      dVar60 = (dVar60 - dVar63) + (dVar60 - dVar63);
                      uVar66 = 0;
                      uVar67 = 0;
                      if (0.0 <= dVar60 * dVar61) {
                        dVar61 = ABS(dVar61);
                        dVar60 = ABS(dVar60);
                        if (dVar60 <= dVar61) {
                          dVar61 = dVar60;
                        }
                        uVar66 = SUB84(dVar61,0);
                        uVar67 = (undefined4)((ulong)dVar61 >> 0x20);
                      }
                      dVar60 = ABS(dVar59);
                      if (dVar62 <= ABS(dVar59)) {
                        dVar60 = dVar62;
                      }
                      dVar60 = dVar60 * (double)((ulong)dVar59 & 0x8000000000000000 |
                                                0x3ff0000000000000);
                      dVar62 = ABS(dVar57);
                      if (dVar64 <= ABS(dVar57)) {
                        dVar62 = dVar64;
                      }
                      dVar62 = dVar62 * (double)((ulong)dVar57 & 0x8000000000000000 |
                                                0x3ff0000000000000);
                      dVar64 = ABS(dVar65);
                      if ((double)CONCAT44(uVar67,uVar66) <= dVar64) {
                        dVar64 = (double)CONCAT44(uVar67,uVar66);
                      }
                      dVar64 = dVar64 * (double)((ulong)dVar65 & 0x8000000000000000 |
                                                0x3ff0000000000000);
                      if ((((dVar60 != 0.0) || (NAN(dVar60))) || (dVar62 != 0.0)) || (NAN(dVar62)))
                      {
LAB_005aa6b6:
                        lVar41 = -1;
                        dVar57 = dVar63;
                        dVar59 = dVar63;
                        do {
                          lVar24 = -1;
                          do {
                            lVar52 = 3;
                            lVar23 = lVar22;
                            dVar61 = dVar57;
                            dVar65 = dVar59;
                            do {
                              dVar59 = *(double *)
                                        ((long)local_238.p +
                                        (lVar23 >> 0x1d) +
                                        (iVar50 + (int)lVar24) * local_238.jstride * 8 +
                                        (iVar19 + (int)lVar41) * local_238.kstride * 8 + lVar53 * 8)
                              ;
                              dVar57 = dVar59;
                              if (dVar61 <= dVar59) {
                                dVar57 = dVar61;
                              }
                              if (dVar59 <= dVar65) {
                                dVar59 = dVar65;
                              }
                              lVar23 = lVar23 + 0x100000000;
                              lVar52 = lVar52 + -1;
                              dVar61 = dVar57;
                              dVar65 = dVar59;
                            } while (lVar52 != 0);
                            lVar24 = lVar24 + 1;
                          } while (lVar24 != 2);
                          lVar41 = lVar41 + 1;
                        } while (lVar41 != 2);
                        auVar68._0_8_ = ABS(dVar60) * (double)(iVar4 + -1);
                        auVar68._8_8_ = ABS(dVar64) * (double)(iVar3 + -1);
                        auVar68 = divpd(auVar68,auVar58);
                        dVar61 = auVar68._8_8_ +
                                 (ABS(dVar62) * (double)(iVar21 + -1)) / (double)(iVar21 * 2) +
                                 auVar68._0_8_;
                        uVar48 = -(ulong)(dVar59 - dVar63 < dVar61);
                        dVar59 = (double)(~uVar48 & 0x3ff0000000000000 |
                                         (ulong)((dVar59 - dVar63) / dVar61) & uVar48);
                        uVar48 = -(ulong)(dVar63 - dVar57 < dVar59 * dVar61);
                        dVar59 = (double)(uVar48 & (ulong)((dVar63 - dVar57) / dVar61) |
                                         ~uVar48 & (ulong)dVar59);
                      }
                      else {
                        dVar59 = 1.0;
                        if ((dVar64 != 0.0) || (NAN(dVar64))) goto LAB_005aa6b6;
                      }
                      lVar41 = lVar17 - local_270;
                      local_2c0[lVar31 + lVar41 + local_3c8 * local_1e0] = dVar60 * dVar59;
                      local_2c0[lVar31 + lVar41 + (nc + iVar20) * local_1e0] = dVar62 * dVar59;
                      local_2c0[lVar31 + lVar41 + ((int)local_1e8 + iVar20) * local_1e0] =
                           dVar64 * dVar59;
                      lVar22 = lVar22 + 0x100000000;
                      lVar17 = lVar17 + 1;
                    } while (local_348.bigend.vect[0] + 1U != iVar29);
                  }
                  bVar56 = uVar30 != local_348.bigend.vect[1];
                  uVar30 = uVar30 + 1;
                } while (bVar56);
              }
              bVar56 = iVar14 != local_348.bigend.vect[2];
              iVar14 = iVar14 + 1;
            } while (bVar56);
          }
          local_3c8 = local_3c8 + 1;
        } while (local_3c8 != local_318);
      }
      if (0 < nc) {
        uVar48 = (ulong)iVar28;
        iVar14 = (iVar38 - iVar28) + 1;
        local_47c = local_264;
        local_440 = 0;
        do {
          if ((int)uVar35 <= (int)uVar49) {
            iVar20 = (int)local_440;
            uVar15 = uVar35;
            do {
              if ((int)uVar33 <= (int)uVar44) {
                uVar30 = uVar15 + 1;
                uVar36 = -uVar30;
                if (0 < (int)uVar30) {
                  uVar36 = uVar30;
                }
                iVar1 = ratio->vect[0];
                iVar2 = ratio->vect[1];
                iVar5 = ratio->vect[2];
                uVar30 = ~(uVar36 >> 2);
                if (-1 < (int)uVar15) {
                  uVar30 = uVar15 >> 2;
                }
                uVar45 = ~(uVar36 >> 1);
                if (-1 < (int)uVar15) {
                  uVar45 = uVar15 >> 1;
                }
                uVar25 = uVar33;
                do {
                  if (iVar28 <= iVar38) {
                    pdVar27 = (double *)
                              ((long)local_70.p +
                              ((long)(int)uVar25 - (long)local_70.begin.y) * local_70.jstride * 8 +
                              local_70.nstride * (long)local_47c * 8 +
                              ((long)(int)uVar15 - (long)local_70.begin.z) * local_70.kstride * 8 +
                              (long)local_70.begin.x * -8 + uVar48 * 8);
                    uVar39 = uVar25 + 1;
                    uVar46 = -uVar39;
                    if (0 < (int)uVar39) {
                      uVar46 = uVar39;
                    }
                    uVar43 = uVar48;
                    iVar54 = iVar14;
                    uVar39 = ~(uVar46 >> 2);
                    uVar47 = ~(uVar46 >> 1);
                    if (-1 < (int)uVar25) {
                      uVar39 = uVar25 >> 2;
                      uVar47 = uVar25 >> 1;
                    }
                    do {
                      uVar40 = (uint)uVar43;
                      if (iVar1 == 4) {
                        if ((long)uVar43 < 0) {
                          uVar51 = uVar40 + 1;
                          uVar11 = -uVar51;
                          if (0 < (int)uVar51) {
                            uVar11 = uVar51;
                          }
                          uVar11 = uVar11 >> 2;
LAB_005aabe9:
                          uVar11 = ~uVar11;
                        }
                        else {
                          uVar11 = (uint)(uVar43 >> 2) & 0x3fffffff;
                        }
                      }
                      else if (iVar1 == 2) {
                        if ((long)uVar43 < 0) {
                          uVar51 = uVar40 + 1;
                          uVar11 = -uVar51;
                          if (0 < (int)uVar51) {
                            uVar11 = uVar51;
                          }
                          uVar11 = uVar11 >> 1;
                          goto LAB_005aabe9;
                        }
                        uVar11 = (uint)(uVar43 >> 1) & 0x7fffffff;
                      }
                      else {
                        uVar11 = uVar40;
                        if (iVar1 != 1) {
                          if ((long)uVar43 < 0) {
                            iVar21 = uVar40 + 1;
                            iVar19 = -iVar21;
                            if (0 < iVar21) {
                              iVar19 = iVar21;
                            }
                            uVar11 = iVar19 / iVar1;
                            goto LAB_005aabe9;
                          }
                          uVar11 = (uint)((long)((ulong)(uint)((int)uVar40 >> 0x1f) << 0x20 |
                                                uVar43 & 0xffffffff) / (long)iVar1);
                        }
                      }
                      uVar51 = uVar25;
                      if (((iVar2 != 1) && (uVar51 = uVar39, iVar2 != 4)) &&
                         (uVar51 = uVar47, iVar2 != 2)) {
                        if ((int)uVar25 < 0) {
                          uVar51 = ~((int)uVar46 / iVar2);
                        }
                        else {
                          uVar51 = (int)uVar25 / iVar2;
                        }
                      }
                      uVar12 = uVar15;
                      if (((iVar5 != 1) && (uVar12 = uVar30, iVar5 != 4)) &&
                         (uVar12 = uVar45, iVar5 != 2)) {
                        if ((int)uVar15 < 0) {
                          uVar12 = ~((int)uVar36 / iVar5);
                        }
                        else {
                          uVar12 = (int)uVar15 / iVar5;
                        }
                      }
                      lVar16 = (long)(int)(uVar11 - (int)local_270);
                      lVar53 = (int)(uVar51 - (int)local_278) * local_2f8;
                      lVar37 = (int)(uVar12 - (int)local_288) * local_1d0;
                      *pdVar27 = (((double)(int)(uVar15 - uVar12 * iVar5) + 0.5) / (double)iVar5 +
                                 -0.5) * local_280[lVar53 + lVar16 + lVar37 + ((int)local_1e8 +
                                                                              iVar20) * local_1e0] +
                                 (((double)(int)(uVar25 - uVar51 * iVar2) + 0.5) / (double)iVar2 +
                                 -0.5) * local_280[lVar53 + lVar16 + lVar37 + (nc + iVar20) *
                                                                              local_1e0] +
                                 (((double)(int)(-iVar1 * uVar11 + uVar40) + 0.5) / (double)iVar1 +
                                 -0.5) * local_280[lVar53 + lVar16 + lVar37 + local_440 * local_1e0]
                                 + local_238.p
                                   [((long)(int)uVar51 - (long)local_238.begin.y) *
                                    local_238.jstride +
                                    ((long)(int)uVar11 - (long)local_238.begin.x) +
                                    ((long)(int)uVar12 - (long)local_238.begin.z) *
                                    local_238.kstride +
                                    local_238.nstride * ((int)local_2f0 + iVar20)];
                      pdVar27 = pdVar27 + 1;
                      iVar54 = iVar54 + -1;
                      uVar43 = uVar43 + 1;
                    } while (iVar54 != 0);
                  }
                  bVar56 = uVar25 != uVar44;
                  uVar25 = uVar25 + 1;
                } while (bVar56);
              }
              bVar56 = uVar15 != uVar49;
              uVar15 = uVar15 + 1;
            } while (bVar56);
          }
          local_440 = local_440 + 1;
          local_47c = local_47c + 1;
        } while (local_440 != local_318);
      }
      MFIter::operator++(&local_118);
    } while (local_118.currentIndex < local_118.endIndex);
  }
  MFIter::~MFIter(&local_118);
  local_b8._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00837b90;
  BaseFab<double>::clear(&local_b8);
  return;
}

Assistant:

void
MFCellConsLinInterp::interp (MultiFab const& crsemf, int ccomp, MultiFab& finemf, int fcomp, int nc,
                             IntVect const& ng, Geometry const& cgeom, Geometry const& fgeom,
                             Box const& dest_domain, IntVect const& ratio,
                             Vector<BCRec> const& bcs, int bcomp)
{
    AMREX_ASSERT(crsemf.nGrowVect() == 0);
    amrex::ignore_unused(fgeom);

    Box const& cdomain = cgeom.Domain();

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        MultiFab crse_tmp(crsemf.boxArray(), crsemf.DistributionMap(), AMREX_SPACEDIM*nc, 0);
        auto const& crse = crsemf.const_arrays();
        auto const& tmp = crse_tmp.arrays();
        auto const& ctmp = crse_tmp.const_arrays();
        auto const& fine = finemf.arrays();

        Gpu::DeviceVector<BCRec> d_bc(nc);
        BCRec const* pbc = d_bc.data();
        Gpu::copyAsync(Gpu::hostToDevice, bcs.begin()+bcomp, bcs.begin()+bcomp+nc, d_bc.begin());

#if (AMREX_SPACEDIM == 1)
        if (cgeom.IsSPHERICAL()) {
            Real drf = fgeom.CellSize(0);
            Real rlo = fgeom.Offset(0);
            if (do_linear_limiting) {
                ParallelFor(crsemf, IntVect(-1),
                [=] AMREX_GPU_DEVICE (int box_no, int i, int, int) noexcept
                {
                    mf_cell_cons_lin_interp_llslope(i,0,0, tmp[box_no], crse[box_no], ccomp, nc,
                                                    cdomain, pbc);
                });
            } else {
                ParallelFor(crsemf, IntVect(-1), nc,
                [=] AMREX_GPU_DEVICE (int box_no, int i, int, int, int n) noexcept
                {
                    mf_cell_cons_lin_interp_mcslope_sph(i, n, tmp[box_no], crse[box_no], ccomp, nc,
                                                        cdomain, ratio, pbc, drf, rlo);
                });
            }

            ParallelFor(finemf, ng, nc,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int, int, int n) noexcept
            {
                if (dest_domain.contains(i,0,0)) {
                    mf_cell_cons_lin_interp_sph(i, n, fine[box_no], fcomp, ctmp[box_no],
                                                crse[box_no], ccomp, nc, ratio, drf, rlo);
                }
            });
        } else
#elif (AMREX_SPACEDIM == 2)
        if (cgeom.IsRZ()) {
            Real drf = fgeom.CellSize(0);
            Real rlo = fgeom.Offset(0);
            if (do_linear_limiting) {
                ParallelFor(crsemf, IntVect(-1),
                [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int) noexcept
                {
                    mf_cell_cons_lin_interp_llslope(i,j,0, tmp[box_no], crse[box_no], ccomp, nc,
                                                    cdomain, pbc);
                });
            } else {
                ParallelFor(crsemf, IntVect(-1), nc,
                [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int, int n) noexcept
                {
                    mf_cell_cons_lin_interp_mcslope_rz(i,j,n, tmp[box_no], crse[box_no], ccomp, nc,
                                                       cdomain, ratio, pbc, drf, rlo);
                });
            }

            ParallelFor(finemf, ng, nc,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int, int n) noexcept
            {
                if (dest_domain.contains(i,j,0)) {
                    mf_cell_cons_lin_interp_rz(i, j, n, fine[box_no], fcomp, ctmp[box_no],
                                               crse[box_no], ccomp, nc, ratio, drf, rlo);
                }
            });
        } else
#endif
        {
            if (do_linear_limiting) {
                ParallelFor(crsemf, IntVect(-1),
                [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                {
                    mf_cell_cons_lin_interp_llslope(i,j,k, tmp[box_no], crse[box_no], ccomp, nc,
                                                    cdomain, pbc);
                });
            } else {
                ParallelFor(crsemf, IntVect(-1), nc,
                [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
                {
                    mf_cell_cons_lin_interp_mcslope(i,j,k,n, tmp[box_no], crse[box_no], ccomp, nc,
                                                    cdomain, ratio, pbc);
                });
            }

            ParallelFor(finemf, ng, nc,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
            {
                if (dest_domain.contains(i,j,k)) {
                    mf_cell_cons_lin_interp(i,j,k,n, fine[box_no], fcomp, ctmp[box_no],
                                            crse[box_no], ccomp, nc, ratio);
                }
            });
        }

        Gpu::streamSynchronize();
    } else
#endif
    {
        BCRec const* pbc = bcs.data() + bcomp;

#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        {
            FArrayBox tmpfab;
            for (MFIter mfi(finemf); mfi.isValid(); ++mfi) {
                auto const& fine = finemf.array(mfi);
                auto const& crse = crsemf.const_array(mfi);

                Box const& cbox = amrex::grow(crsemf[mfi].box(), -1);
                tmpfab.resize(cbox, AMREX_SPACEDIM*nc);
                auto const& tmp = tmpfab.array();
                auto const& ctmp = tmpfab.const_array();

                Box const& fbox = amrex::grow(mfi.validbox(), ng) & dest_domain;

#if (AMREX_SPACEDIM == 1)
                if (cgeom.IsSPHERICAL()) {
                    Real drf = fgeom.CellSize(0);
                    Real rlo = fgeom.Offset(0);
                    if (do_linear_limiting) {
                        amrex::LoopConcurrentOnCpu(cbox,
                        [&] (int i, int, int) noexcept
                        {
                            mf_cell_cons_lin_interp_llslope(i,0,0, tmp, crse, ccomp, nc,
                                                            cdomain, pbc);
                        });
                    } else {
                        amrex::LoopConcurrentOnCpu(cbox, nc,
                        [&] (int i, int, int, int n) noexcept
                        {
                            mf_cell_cons_lin_interp_mcslope_sph(i, n, tmp, crse, ccomp, nc,
                                                                cdomain, ratio, pbc, drf, rlo);
                        });
                    }

                    amrex::LoopConcurrentOnCpu(fbox, nc,
                    [&] (int i, int, int, int n) noexcept
                    {
                        mf_cell_cons_lin_interp_sph(i, n, fine, fcomp, ctmp,
                                                    crse, ccomp, nc, ratio, drf, rlo);
                    });
                } else
#elif (AMREX_SPACEDIM == 2)
                if (cgeom.IsRZ()) {
                    Real drf = fgeom.CellSize(0);
                    Real rlo = fgeom.Offset(0);
                    if (do_linear_limiting) {
                        amrex::LoopConcurrentOnCpu(cbox,
                        [&] (int i, int j, int) noexcept
                        {
                            mf_cell_cons_lin_interp_llslope(i,j,0, tmp, crse, ccomp, nc,
                                                            cdomain, pbc);
                        });
                    } else {
                        amrex::LoopConcurrentOnCpu(cbox, nc,
                        [&] (int i, int j, int, int n) noexcept
                        {
                            mf_cell_cons_lin_interp_mcslope_rz(i, j, n, tmp, crse, ccomp, nc,
                                                               cdomain, ratio, pbc, drf, rlo);
                        });
                    }

                    amrex::LoopConcurrentOnCpu(fbox, nc,
                    [&] (int i, int j, int, int n) noexcept
                    {
                        mf_cell_cons_lin_interp_rz(i, j, n, fine, fcomp, ctmp,
                                                   crse, ccomp, nc, ratio, drf, rlo);
                    });
                } else
#endif
                {
                    if (do_linear_limiting) {
                        amrex::LoopConcurrentOnCpu(cbox,
                        [&] (int i, int j, int k) noexcept
                        {
                            mf_cell_cons_lin_interp_llslope(i,j,k, tmp, crse, ccomp, nc,
                                                            cdomain, pbc);
                        });
                    } else {
                        amrex::LoopConcurrentOnCpu(cbox, nc,
                        [&] (int i, int j, int k, int n) noexcept
                        {
                            mf_cell_cons_lin_interp_mcslope(i,j,k,n, tmp, crse, ccomp, nc,
                                                            cdomain, ratio, pbc);
                        });
                    }

                    amrex::LoopConcurrentOnCpu(fbox, nc,
                    [&] (int i, int j, int k, int n) noexcept
                    {
                        mf_cell_cons_lin_interp(i,j,k,n, fine, fcomp, ctmp,
                                                crse, ccomp, nc, ratio);
                    });
                }
            }
        }
    }
}